

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman_tests.cpp
# Opt level: O0

void addrman_tests::addrman_update_address_invoker(void)

{
  basic_wrap_stringstream<char> *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *file;
  basic_wrap_stringstream<char> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  long in_FS_OFFSET;
  addrman_update_address t;
  basic_wrap_stringstream<char> *in_stack_fffffffffffff1f8;
  std_string *in_stack_fffffffffffff200;
  basic_wrap_stringstream<char> *in_stack_fffffffffffff208;
  addrman_update_address *in_stack_fffffffffffff218;
  const_string *in_stack_fffffffffffff220;
  const_string *msg;
  size_t in_stack_fffffffffffff228;
  size_t line_num;
  const_string *in_stack_fffffffffffff230;
  unit_test_log_t *in_stack_fffffffffffff238;
  const_string local_c38 [25];
  undefined1 local_aa0 [408];
  undefined1 local_908 [408];
  undefined1 local_770 [408];
  addrman_update_address local_5d8;
  undefined1 local_1a0 [408];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff208,
             (pointer)in_stack_fffffffffffff200,(unsigned_long)in_stack_fffffffffffff1f8);
  memset(local_1a0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff1f8);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff1f8);
  boost::operator<<(in_stack_fffffffffffff208,(char *)in_stack_fffffffffffff200);
  boost::operator<<(in_stack_fffffffffffff208,(char (*) [23])in_stack_fffffffffffff200);
  boost::operator<<(in_stack_fffffffffffff208,(char (*) [15])in_stack_fffffffffffff200);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff208);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff208,in_stack_fffffffffffff200);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_fffffffffffff238,in_stack_fffffffffffff230,in_stack_fffffffffffff228,
             in_stack_fffffffffffff220);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff1f8);
  addrman_update_address::addrman_update_address(in_stack_fffffffffffff218);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff208,
             (pointer)in_stack_fffffffffffff200,(unsigned_long)in_stack_fffffffffffff1f8);
  memset(local_770,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff1f8);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff1f8);
  boost::operator<<(in_stack_fffffffffffff208,(char *)in_stack_fffffffffffff200);
  boost::operator<<(in_stack_fffffffffffff208,(char (*) [23])in_stack_fffffffffffff200);
  boost::operator<<(in_stack_fffffffffffff208,(char (*) [16])in_stack_fffffffffffff200);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff208);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff208,in_stack_fffffffffffff200);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_fffffffffffff238,in_stack_fffffffffffff230,in_stack_fffffffffffff228,
             in_stack_fffffffffffff220);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff1f8);
  boost::unit_test::setup_conditional<addrman_tests::addrman_update_address>
            ((addrman_update_address *)0x326220);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff208,
             (pointer)in_stack_fffffffffffff200,(unsigned_long)in_stack_fffffffffffff1f8);
  memset(local_908,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff1f8);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff1f8);
  boost::operator<<(in_stack_fffffffffffff208,(char *)in_stack_fffffffffffff200);
  boost::operator<<(in_stack_fffffffffffff208,(char (*) [23])in_stack_fffffffffffff200);
  boost::operator<<(in_stack_fffffffffffff208,(char (*) [13])in_stack_fffffffffffff200);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff208);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff208,in_stack_fffffffffffff200);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_fffffffffffff238,in_stack_fffffffffffff230,in_stack_fffffffffffff228,
             in_stack_fffffffffffff220);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff1f8);
  addrman_update_address::test_method(&local_5d8);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff208,
             (pointer)in_stack_fffffffffffff200,(unsigned_long)in_stack_fffffffffffff1f8);
  memset(local_aa0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff1f8);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff1f8);
  boost::operator<<(in_stack_fffffffffffff208,(char *)in_stack_fffffffffffff200);
  boost::operator<<(in_stack_fffffffffffff208,(char (*) [23])in_stack_fffffffffffff200);
  this = boost::operator<<(in_stack_fffffffffffff208,(char (*) [19])in_stack_fffffffffffff200);
  file = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff208);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff208,in_stack_fffffffffffff200);
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this,(const_string *)file,in_stack_fffffffffffff228,
             in_stack_fffffffffffff220);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff1f8);
  boost::unit_test::teardown_conditional<addrman_tests::addrman_update_address>
            ((addrman_update_address *)0x326446);
  line_num = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff208,
             (pointer)in_stack_fffffffffffff200,(unsigned_long)in_stack_fffffffffffff1f8);
  msg = local_c38;
  memset(msg,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff1f8);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff1f8);
  boost::operator<<(in_stack_fffffffffffff208,(char *)in_stack_fffffffffffff200);
  boost::operator<<(in_stack_fffffffffffff208,(char (*) [23])in_stack_fffffffffffff200);
  this_00 = boost::operator<<(in_stack_fffffffffffff208,(char (*) [15])in_stack_fffffffffffff200);
  s = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(this_00);
  boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00,s)
  ;
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this,(const_string *)file,line_num,msg);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff1f8);
  addrman_update_address::~addrman_update_address
            ((addrman_update_address *)in_stack_fffffffffffff1f8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(addrman_update_address)
{
    // Tests updating nTime via Connected() and nServices via SetServices() and Add()
    auto addrman = std::make_unique<AddrMan>(EMPTY_NETGROUPMAN, DETERMINISTIC, GetCheckRatio(m_node));
    CNetAddr source{ResolveIP("252.2.2.2")};
    CAddress addr{CAddress(ResolveService("250.1.1.1", 8333), NODE_NONE)};

    const auto start_time{Now<NodeSeconds>() - 10000s};
    addr.nTime = start_time;
    BOOST_CHECK(addrman->Add({addr}, source));
    BOOST_CHECK_EQUAL(addrman->Size(), 1U);

    // Updating an addrman entry with a different port doesn't change it
    CAddress addr_diff_port{CAddress(ResolveService("250.1.1.1", 8334), NODE_NONE)};
    addr_diff_port.nTime = start_time;
    addrman->Connected(addr_diff_port);
    addrman->SetServices(addr_diff_port, NODE_NETWORK_LIMITED);
    std::vector<CAddress> vAddr1{addrman->GetAddr(/*max_addresses=*/0, /*max_pct=*/0, /*network=*/std::nullopt)};
    BOOST_CHECK_EQUAL(vAddr1.size(), 1U);
    BOOST_CHECK(vAddr1.at(0).nTime == start_time);
    BOOST_CHECK_EQUAL(vAddr1.at(0).nServices, NODE_NONE);

    // Updating an addrman entry with the correct port is successful
    addrman->Connected(addr);
    addrman->SetServices(addr, NODE_NETWORK_LIMITED);
    std::vector<CAddress> vAddr2 = addrman->GetAddr(/*max_addresses=*/0, /*max_pct=*/0, /*network=*/std::nullopt);
    BOOST_CHECK_EQUAL(vAddr2.size(), 1U);
    BOOST_CHECK(vAddr2.at(0).nTime >= start_time + 10000s);
    BOOST_CHECK_EQUAL(vAddr2.at(0).nServices, NODE_NETWORK_LIMITED);

    // Updating an existing addr through Add() (used in gossip relay) can add additional services but can't remove existing ones.
    CAddress addr_v2{CAddress(ResolveService("250.1.1.1", 8333), NODE_P2P_V2)};
    addr_v2.nTime = start_time;
    BOOST_CHECK(!addrman->Add({addr_v2}, source));
    std::vector<CAddress> vAddr3{addrman->GetAddr(/*max_addresses=*/0, /*max_pct=*/0, /*network=*/std::nullopt)};
    BOOST_CHECK_EQUAL(vAddr3.size(), 1U);
    BOOST_CHECK_EQUAL(vAddr3.at(0).nServices, NODE_P2P_V2 | NODE_NETWORK_LIMITED);

    // SetServices() (used when we connected to them) overwrites existing service flags
    addrman->SetServices(addr, NODE_NETWORK);
    std::vector<CAddress> vAddr4{addrman->GetAddr(/*max_addresses=*/0, /*max_pct=*/0, /*network=*/std::nullopt)};
    BOOST_CHECK_EQUAL(vAddr4.size(), 1U);
    BOOST_CHECK_EQUAL(vAddr4.at(0).nServices, NODE_NETWORK);

    // Promoting to Tried does not affect the service flags
    BOOST_CHECK(addrman->Good(addr)); // addr has NODE_NONE
    std::vector<CAddress> vAddr5{addrman->GetAddr(/*max_addresses=*/0, /*max_pct=*/0, /*network=*/std::nullopt)};
    BOOST_CHECK_EQUAL(vAddr5.size(), 1U);
    BOOST_CHECK_EQUAL(vAddr5.at(0).nServices, NODE_NETWORK);

    // Adding service flags even works when the addr is in Tried
    BOOST_CHECK(!addrman->Add({addr_v2}, source));
    std::vector<CAddress> vAddr6{addrman->GetAddr(/*max_addresses=*/0, /*max_pct=*/0, /*network=*/std::nullopt)};
    BOOST_CHECK_EQUAL(vAddr6.size(), 1U);
    BOOST_CHECK_EQUAL(vAddr6.at(0).nServices, NODE_NETWORK | NODE_P2P_V2);
}